

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

const_iterator __thiscall VulkanHppGenerator::findFeature(VulkanHppGenerator *this,string *name)

{
  borrowed_iterator_t<const_std::vector<VulkanHppGenerator::FeatureData>_&> bVar1;
  string *name_local;
  VulkanHppGenerator *this_local;
  
  bVar1 = std::ranges::__find_if_fn::
          operator()<const_std::vector<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]Vulkan_Hpp_VulkanHppGenerator_cpp:2092:44)>
                    ((__find_if_fn *)&std::ranges::find_if,&this->m_features,name);
  return (const_iterator)bVar1._M_current;
}

Assistant:

std::vector<VulkanHppGenerator::FeatureData>::const_iterator VulkanHppGenerator::findFeature( std::string const & name ) const
{
  return std::ranges::find_if( m_features, [&name]( FeatureData const & fd ) { return fd.name == name; } );
}